

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::reserve
          (stack<c4::yml::Parser::State,_16UL> *this,size_t sz)

{
  void *__dest;
  ulong in_RSI;
  long in_RDI;
  State *buf;
  
  if (*(ulong *)(in_RDI + 0x988) < in_RSI) {
    if (in_RSI < 0x11) {
      *(long *)(in_RDI + 0x980) = in_RDI;
      *(undefined8 *)(in_RDI + 0x990) = 0x10;
    }
    else {
      __dest = (void *)(**(code **)(in_RDI + 0x9a0))
                                 (in_RSI * 0x98,*(undefined8 *)(in_RDI + 0x980),
                                  *(undefined8 *)(in_RDI + 0x998));
      memcpy(__dest,*(void **)(in_RDI + 0x980),*(long *)(in_RDI + 0x988) * 0x98);
      if (*(long *)(in_RDI + 0x980) != in_RDI) {
        (**(code **)(in_RDI + 0x9a8))
                  (*(undefined8 *)(in_RDI + 0x980),*(long *)(in_RDI + 0x990) * 0x98,
                   *(undefined8 *)(in_RDI + 0x998));
      }
      *(void **)(in_RDI + 0x980) = __dest;
      *(ulong *)(in_RDI + 0x990) = in_RSI;
    }
  }
  return;
}

Assistant:

void stack<T, N>::reserve(size_t sz)
{
    if(sz <= m_size)
        return;
    if(sz <= N)
    {
        m_stack = m_buf;
        m_capacity = N;
        return;
    }
    T *buf = (T*) m_callbacks.m_allocate(sz * sizeof(T), m_stack, m_callbacks.m_user_data);
    memcpy(buf, m_stack, m_size * sizeof(T));
    if(m_stack != m_buf)
    {
        m_callbacks.m_free(m_stack, m_capacity * sizeof(T), m_callbacks.m_user_data);
    }
    m_stack = buf;
    m_capacity = sz;
}